

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.h
# Opt level: O0

void __thiscall
icu_63::number::impl::CurrencyPluralInfoAffixProvider::CurrencyPluralInfoAffixProvider
          (CurrencyPluralInfoAffixProvider *this)

{
  PropertiesAffixPatternProvider *local_28;
  CurrencyPluralInfoAffixProvider *this_local;
  
  AffixPatternProvider::AffixPatternProvider(&this->super_AffixPatternProvider);
  (this->super_AffixPatternProvider)._vptr_AffixPatternProvider =
       (_func_int **)&PTR__CurrencyPluralInfoAffixProvider_004f0420;
  local_28 = this->affixesByPlural;
  do {
    PropertiesAffixPatternProvider::PropertiesAffixPatternProvider(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != (PropertiesAffixPatternProvider *)&this->fBogus);
  this->fBogus = true;
  return;
}

Assistant:

bool isBogus() const {
        return fBogus;
    }